

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_signalfd_epoll.c
# Opt level: O1

void handle_signals(void)

{
  ssize_t sVar1;
  char *__s;
  signalfd_siginfo sfd_si;
  int local_80 [32];
  
  sVar1 = read(sfd,local_80,0x80);
  if (sVar1 != -1) {
    if (local_80[0] == 0xe) {
      __s = "Got SIGALRM via SignalFD.";
    }
    else {
      if (local_80[0] == 3) goto LAB_00101673;
      __s = "Got unexpected signal!";
    }
    puts(__s);
    return;
  }
  handle_signals_cold_1();
LAB_00101673:
  puts("Got SIGQUIT. Will exit.");
  exit(0);
}

Assistant:

void handle_signals() {
    struct signalfd_siginfo sfd_si;
    if (read(sfd, &sfd_si, sizeof(sfd_si)) == -1)
        handle_error("read()");

    if (sfd_si.ssi_signo == SIGALRM)
        printf("Got SIGALRM via SignalFD.\n");
    else if (sfd_si.ssi_signo == SIGQUIT) {
        printf("Got SIGQUIT. Will exit.\n");
        exit(0);
    }
    else
        printf("Got unexpected signal!\n");
}